

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O1

void __thiscall string_find_Test::TestBody(string_find_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined1 auVar2 [8];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  char *pcVar4;
  char *pcVar5;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_34;
  string haystack;
  undefined1 local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  char acStack_100 [16];
  AssertHelper local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  undefined1 local_e0 [16];
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  undefined1 auStack_c0 [16];
  undefined1 local_b0 [32];
  string local_90;
  string local_70;
  undefined8 *local_50;
  size_t local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"ABCDabcd",9);
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ = (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_sensitive)
  ;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"0",
             "ST::string::from_validated(\"\" \"ABCDabcd\" \"\", sizeof(\"ABCDabcd\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x673,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = 4;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])operator_new__(0x11);
  *(undefined8 *)local_110 = 0x4443424164636261;
  *(undefined8 *)((long)local_110 + 8) = 0x6463626144434241;
  *(char *)((long)local_110 + 0x10) = '\0';
  local_f0.data_ = (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_sensitive)
  ;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"4",
             "ST::string::from_validated(\"\" \"abcdABCDABCDabcd\" \"\", sizeof(\"abcdABCDABCDabcd\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x674,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = 4;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
  builtin_strncpy(acStack_100,"abcdABCDabcd",0xd);
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ = (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_sensitive)
  ;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"4",
             "ST::string::from_validated(\"\" \"abcdABCDabcd\" \"\", sizeof(\"abcdABCDabcd\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x675,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = 4;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"abcdABCD",9);
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ = (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_sensitive)
  ;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"4",
             "ST::string::from_validated(\"\" \"abcdABCD\" \"\", sizeof(\"abcdABCD\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x676,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"ABCDxxxx",9);
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"0",
             "ST::string::from_validated(\"\" \"ABCDxxxx\" \"\", sizeof(\"ABCDxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x679,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = 4;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])operator_new__(0x11);
  *(undefined8 *)local_110 = 0x4443424178787878;
  *(undefined8 *)((long)local_110 + 8) = 0x7878787844434241;
  *(char *)((long)local_110 + 0x10) = '\0';
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"4",
             "ST::string::from_validated(\"\" \"xxxxABCDABCDxxxx\" \"\", sizeof(\"xxxxABCDABCDxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = 4;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
  builtin_strncpy(acStack_100,"xxxxABCDxxxx",0xd);
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"4",
             "ST::string::from_validated(\"\" \"xxxxABCDxxxx\" \"\", sizeof(\"xxxxABCDxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = 4;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxxABCD",9);
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"4",
             "ST::string::from_validated(\"\" \"xxxxABCD\" \"\", sizeof(\"xxxxABCD\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"abcdxxxx",9);
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"0",
             "ST::string::from_validated(\"\" \"abcdxxxx\" \"\", sizeof(\"abcdxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = 4;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])operator_new__(0x11);
  *(undefined8 *)local_110 = 0x6463626178787878;
  *(undefined8 *)((long)local_110 + 8) = 0x7878787844434241;
  *(char *)((long)local_110 + 0x10) = '\0';
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"4",
             "ST::string::from_validated(\"\" \"xxxxabcdABCDxxxx\" \"\", sizeof(\"xxxxabcdABCDxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = 4;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
  builtin_strncpy(acStack_100,"xxxxabcdxxxx",0xd);
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"4",
             "ST::string::from_validated(\"\" \"xxxxabcdxxxx\" \"\", sizeof(\"xxxxabcdxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x67f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = 4;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxxabcd",9);
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"4",
             "ST::string::from_validated(\"\" \"xxxxabcd\" \"\", sizeof(\"xxxxabcd\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x680,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"ABCDxxxx",9);
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"abcd",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"0",
             "ST::string::from_validated(\"\" \"ABCDxxxx\" \"\", sizeof(\"ABCDxxxx\") - 1).find(\"abcd\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x681,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = 4;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])operator_new__(0x11);
  *(undefined8 *)local_110 = 0x4443424178787878;
  *(undefined8 *)((long)local_110 + 8) = 0x7878787864636261;
  *(char *)((long)local_110 + 0x10) = '\0';
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"abcd",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"4",
             "ST::string::from_validated(\"\" \"xxxxABCDabcdxxxx\" \"\", sizeof(\"xxxxABCDabcdxxxx\") - 1).find(\"abcd\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x682,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = 4;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
  builtin_strncpy(acStack_100,"xxxxABCDxxxx",0xd);
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"abcd",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"4",
             "ST::string::from_validated(\"\" \"xxxxABCDxxxx\" \"\", sizeof(\"xxxxABCDxxxx\") - 1).find(\"abcd\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x683,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = 4;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxxABCD",9);
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"abcd",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"4",
             "ST::string::from_validated(\"\" \"xxxxABCD\" \"\", sizeof(\"xxxxABCD\") - 1).find(\"abcd\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x684,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = -1;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxx",5);
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ = (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_sensitive)
  ;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x687,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = -1;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxx",5);
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x688,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = -1;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7;
  acStack_100[0xf] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  builtin_strncpy(acStack_100,"xxxxABC",8);
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ = (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_sensitive)
  ;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"-1",
             "ST::string::from_validated(\"\" \"xxxxABC\" \"\", sizeof(\"xxxxABC\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x689,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = -1;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7;
  acStack_100[0xf] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  builtin_strncpy(acStack_100,"xxxxABC",8);
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"-1",
             "ST::string::from_validated(\"\" \"xxxxABC\" \"\", sizeof(\"xxxxABC\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x68a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = -1;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb;
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxxABCxxxx",0xc);
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ = (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_sensitive)
  ;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"-1",
             "ST::string::from_validated(\"\" \"xxxxABCxxxx\" \"\", sizeof(\"xxxxABCxxxx\") - 1).find(\"ABCD\", ST::case_sensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x68b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = -1;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb;
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxxABCxxxx",0xc);
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"-1",
             "ST::string::from_validated(\"\" \"xxxxABCxxxx\" \"\", sizeof(\"xxxxABCxxxx\") - 1).find(\"ABCD\", ST::case_insensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x68c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = -1;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ = (AssertHelperData *)ST::string::find((string *)local_110,0,"AAAA",case_sensitive)
  ;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"-1","ST::string().find(\"AAAA\", ST::case_sensitive)",
             (int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x68f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = -1;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_110,0,"AAAA",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"-1","ST::string().find(\"AAAA\", ST::case_insensitive)",
             (int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x690,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = -1;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxx",5);
  pcVar4 = "";
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ = (AssertHelperData *)ST::string::find((string *)local_110,0,"",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"\", ST::case_sensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x691,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = -1;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxx",5);
  local_f0.data_ = (AssertHelperData *)0xffffffffffffffff;
  local_110 = (undefined1  [8])acStack_100;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find((const char *)nullptr, ST::case_sensitive)"
             ,(int *)local_b0,(long *)&local_f0);
  if ((0xf < local_108) && (local_110 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x692,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_110 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = -1;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  pcVar4 = "";
  local_110 = (undefined1  [8])acStack_100;
  local_f0.data_ = (AssertHelperData *)ST::string::find((string *)local_110,0,"",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"-1","ST::string().find(\"\", ST::case_sensitive)",(int *)local_b0
             ,(long *)&local_f0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x693,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_b0._0_4_ = -1;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_f0.data_ = (AssertHelperData *)0xffffffffffffffff;
  local_110 = (undefined1  [8])acStack_100;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_d0,"-1",
             "ST::string().find((const char *)nullptr, ST::case_sensitive)",(int *)local_b0,
             (long *)&local_f0);
  if ((0xf < local_108) &&
     ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_110 !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0)) {
    operator_delete__((void *)local_110);
  }
  if (local_d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x694,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p)
    ;
  }
  local_c8._M_p = (pointer)0x0;
  auStack_c0._0_8_ = 0;
  auStack_c0._8_8_ = (char *)0x0;
  local_b0._8_8_ = &DAT_00000004;
  local_b0._24_8_ = 0;
  local_b0._16_8_ = 0x78787878;
  local_d0 = (undefined1  [8])auStack_c0;
  local_b0._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b0 + 0x10);
  ST::string::from_utf32
            (&local_90,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xffffffffffffffff,
             check_validity);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  ST::buffer<char>::allocate
            ((buffer<char> *)local_110,(size_t)(local_b0._8_8_ + local_90.m_buffer.m_size));
  if ((pointer)local_b0._8_8_ != (pointer)0x0) {
    memcpy((void *)local_110,(void *)local_b0._0_8_,local_b0._8_8_);
  }
  if (local_90.m_buffer.m_size != 0) {
    memcpy((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_110 + local_b0._8_8_),local_90.m_buffer.m_chars,local_90.m_buffer.m_size);
  }
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p;
  auVar2 = local_d0;
  _Var3._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
  if (local_108 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010
     ) {
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
  }
  local_e0._0_8_ =
       CONCAT17(acStack_100[7],
                CONCAT25(acStack_100._5_2_,CONCAT14(acStack_100[4],acStack_100._0_4_)));
  local_e0._8_8_ =
       CONCAT17(acStack_100[0xf],
                CONCAT25(acStack_100._13_2_,
                         CONCAT14(acStack_100[0xc],
                                  CONCAT13(acStack_100[0xb],
                                           CONCAT21(acStack_100._9_2_,acStack_100[8])))));
  local_f0.data_ = (AssertHelperData *)local_d0;
  local_c8._M_p = (pointer)local_108;
  local_d0 = (undefined1  [8])_Var3._M_head_impl;
  if (local_108 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010
     ) {
    local_d0 = (undefined1  [8])auStack_c0;
  }
  auStack_c0._0_8_ = local_e0._0_8_;
  auStack_c0._8_8_ = local_e0._8_8_;
  if (auVar2 != (undefined1  [8])0x0 && (pointer)0xf < local_e8) {
    operator_delete__((void *)auVar2);
  }
  if ((0xf < local_90.m_buffer.m_size) && (local_90.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_90.m_buffer.m_chars);
  }
  if ((&DAT_0000000f < (ulong)local_b0._8_8_) &&
     ((AssertHelperData *)local_b0._0_8_ != (AssertHelperData *)0x0)) {
    operator_delete__((void *)local_b0._0_8_);
  }
  local_b0._0_4_ = 4;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_d0,0,utf8_test_data,case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_110,"4","haystack.find(utf8_test_data, ST::case_sensitive)",
             (int *)local_b0,(long *)&local_f0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x699,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f0.data_ + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  local_b0._0_4_ = 4;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_d0,0,utf8_test_data,case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_110,"4","haystack.find(utf8_test_data, ST::case_insensitive)",
             (int *)local_b0,(long *)&local_f0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x69a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f0.data_ + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  ST::string::from_utf32
            ((string *)local_b0,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xffffffffffffffff
             ,check_validity);
  pcVar4 = local_90.m_buffer.m_data;
  local_90.m_buffer.m_size = 4;
  local_90.m_buffer.m_data[8] = '\0';
  local_90.m_buffer.m_data[9] = '\0';
  local_90.m_buffer.m_data[10] = '\0';
  local_90.m_buffer.m_data[0xb] = '\0';
  local_90.m_buffer.m_data[0xc] = '\0';
  local_90.m_buffer.m_data[0xd] = '\0';
  local_90.m_buffer.m_data[0xe] = '\0';
  local_90.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_90.m_buffer.m_data,"xxxx",5);
  local_90.m_buffer.m_data[5] = '\0';
  local_90.m_buffer.m_data[6] = '\0';
  local_90.m_buffer.m_data[7] = '\0';
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_90.m_buffer.m_chars = pcVar4;
  ST::buffer<char>::allocate((buffer<char> *)local_110,(size_t)(local_b0._8_8_ + 4));
  if ((pointer)local_b0._8_8_ != (pointer)0x0) {
    memcpy((void *)local_110,(void *)local_b0._0_8_,local_b0._8_8_);
  }
  if (local_90.m_buffer.m_size != 0) {
    memcpy((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_110 + local_b0._8_8_),local_90.m_buffer.m_chars,local_90.m_buffer.m_size);
  }
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p;
  auVar2 = local_d0;
  _Var3._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
  if (local_108 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010
     ) {
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
  }
  local_e0._0_8_ =
       CONCAT17(acStack_100[7],
                CONCAT25(acStack_100._5_2_,CONCAT14(acStack_100[4],acStack_100._0_4_)));
  local_e0._8_8_ =
       CONCAT17(acStack_100[0xf],
                CONCAT25(acStack_100._13_2_,
                         CONCAT14(acStack_100[0xc],
                                  CONCAT13(acStack_100[0xb],
                                           CONCAT21(acStack_100._9_2_,acStack_100[8])))));
  local_f0.data_ = (AssertHelperData *)local_d0;
  local_c8._M_p = (pointer)local_108;
  local_d0 = (undefined1  [8])_Var3._M_head_impl;
  if (local_108 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010
     ) {
    local_d0 = (undefined1  [8])auStack_c0;
  }
  auStack_c0._0_8_ = local_e0._0_8_;
  auStack_c0._8_8_ = local_e0._8_8_;
  if (auVar2 != (undefined1  [8])0x0 &&
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_e8)
  {
    operator_delete__((void *)auVar2);
  }
  if ((0xf < local_90.m_buffer.m_size) && (local_90.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_90.m_buffer.m_chars);
  }
  if ((&DAT_0000000f < (ulong)local_b0._8_8_) && ((void *)local_b0._0_8_ != (void *)0x0)) {
    operator_delete__((void *)local_b0._0_8_);
  }
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_d0,0,utf8_test_data,case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_110,"0","haystack.find(utf8_test_data, ST::case_sensitive)",
             (int *)local_b0,(long *)&local_f0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x69d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f0.data_ + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  local_b0._0_8_ = local_b0._0_8_ & 0xffffffff00000000;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_d0,0,utf8_test_data,case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_110,"0","haystack.find(utf8_test_data, ST::case_insensitive)",
             (int *)local_b0,(long *)&local_f0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x69e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f0.data_ + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  local_90.m_buffer.m_size = 4;
  local_90.m_buffer.m_data[8] = '\0';
  local_90.m_buffer.m_data[9] = '\0';
  local_90.m_buffer.m_data[10] = '\0';
  local_90.m_buffer.m_data[0xb] = '\0';
  local_90.m_buffer.m_data[0xc] = '\0';
  local_90.m_buffer.m_data[0xd] = '\0';
  local_90.m_buffer.m_data[0xe] = '\0';
  local_90.m_buffer.m_data[0xf] = '\0';
  builtin_strncpy(local_90.m_buffer.m_data,"xxxx",5);
  local_90.m_buffer.m_data[5] = '\0';
  local_90.m_buffer.m_data[6] = '\0';
  local_90.m_buffer.m_data[7] = '\0';
  local_90.m_buffer.m_chars = pcVar4;
  ST::string::from_utf32
            (&local_70,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xffffffffffffffff,
             check_validity);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  ST::buffer<char>::allocate
            ((buffer<char> *)local_110,local_70.m_buffer.m_size + local_90.m_buffer.m_size);
  if (local_90.m_buffer.m_size != 0) {
    memcpy((void *)local_110,local_90.m_buffer.m_chars,local_90.m_buffer.m_size);
  }
  if (local_70.m_buffer.m_size != 0) {
    memcpy((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_110 + local_90.m_buffer.m_size),local_70.m_buffer.m_chars,
           local_70.m_buffer.m_size);
  }
  pbVar1 = local_108;
  local_b0._8_8_ = local_108;
  local_b0._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b0 + 0x10);
  if (&DAT_0000000f < local_108) {
    local_b0._0_8_ = local_110;
  }
  local_b0._16_8_ =
       CONCAT17(acStack_100[7],
                CONCAT25(acStack_100._5_2_,CONCAT14(acStack_100[4],acStack_100._0_4_)));
  local_b0._24_8_ =
       CONCAT17(acStack_100[0xf],
                CONCAT25(acStack_100._13_2_,
                         CONCAT14(acStack_100[0xc],
                                  CONCAT13(acStack_100[0xb],
                                           CONCAT21(acStack_100._9_2_,acStack_100[8])))));
  local_50 = &local_40;
  local_48 = 4;
  uStack_38 = 0;
  local_40 = 0x78787878;
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  ST::buffer<char>::allocate((buffer<char> *)local_110,(size_t)((long)pbVar1 + 4));
  if ((pointer)local_b0._8_8_ != (pointer)0x0) {
    memcpy((void *)local_110,(void *)local_b0._0_8_,local_b0._8_8_);
  }
  if (local_48 != 0) {
    memcpy((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_110 + local_b0._8_8_),local_50,local_48);
  }
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_p;
  auVar2 = local_d0;
  _Var3._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
  if (local_108 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010
     ) {
    _Var3._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
  }
  local_e0._0_8_ =
       CONCAT17(acStack_100[7],
                CONCAT25(acStack_100._5_2_,CONCAT14(acStack_100[4],acStack_100._0_4_)));
  local_e0._8_8_ =
       CONCAT17(acStack_100[0xf],
                CONCAT25(acStack_100._13_2_,
                         CONCAT14(acStack_100[0xc],
                                  CONCAT13(acStack_100[0xb],
                                           CONCAT21(acStack_100._9_2_,acStack_100[8])))));
  local_f0.data_ = (AssertHelperData *)local_d0;
  local_c8._M_p = (pointer)local_108;
  local_d0 = (undefined1  [8])_Var3._M_head_impl;
  if (local_108 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010
     ) {
    local_d0 = (undefined1  [8])auStack_c0;
  }
  auStack_c0._0_8_ = local_e0._0_8_;
  auStack_c0._8_8_ = local_e0._8_8_;
  if (auVar2 != (undefined1  [8])0x0 &&
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_e8)
  {
    operator_delete__((void *)auVar2);
  }
  if ((0xf < local_48) && (local_50 != (undefined8 *)0x0)) {
    operator_delete__(local_50);
  }
  if ((&DAT_0000000f < (ulong)local_b0._8_8_) &&
     ((AssertHelperData *)local_b0._0_8_ != (AssertHelperData *)0x0)) {
    operator_delete__((void *)local_b0._0_8_);
  }
  if ((0xf < local_70.m_buffer.m_size) && (local_70.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_70.m_buffer.m_chars);
  }
  if ((0xf < local_90.m_buffer.m_size) && (local_90.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_90.m_buffer.m_chars);
  }
  local_b0._0_4_ = 4;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_d0,0,utf8_test_data,case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_110,"4","haystack.find(utf8_test_data, ST::case_sensitive)",
             (int *)local_b0,(long *)&local_f0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f0.data_ + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  local_b0._0_4_ = 4;
  local_f0.data_ =
       (AssertHelperData *)ST::string::find((string *)local_d0,0,utf8_test_data,case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_110,"4","haystack.find(utf8_test_data, ST::case_insensitive)",
             (int *)local_b0,(long *)&local_f0);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f0);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_f0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f0.data_ + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,0xffffffff);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"ABCDabcd",9);
  local_110 = (undefined1  [8])acStack_100;
  local_b0._0_8_ = ST::string::find((string *)local_110,1,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"-1",
             "ST::string::from_validated(\"\" \"ABCDabcd\" \"\", sizeof(\"ABCDabcd\") - 1).find(1, \"ABCD\", ST::case_sensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,4);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])operator_new__(0x11);
  *(undefined8 *)local_110 = 0x4443424164636261;
  *(undefined8 *)((long)local_110 + 8) = 0x6463626144434241;
  *(char *)((long)local_110 + 0x10) = '\0';
  local_b0._0_8_ = ST::string::find((string *)local_110,1,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"4",
             "ST::string::from_validated(\"\" \"abcdABCDABCDabcd\" \"\", sizeof(\"abcdABCDABCDabcd\") - 1).find(1, \"ABCD\", ST::case_sensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,4);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])operator_new__(0x11);
  *(undefined8 *)local_110 = 0x4443424164636261;
  *(undefined8 *)((long)local_110 + 8) = 0x6463626144434241;
  *(char *)((long)local_110 + 0x10) = '\0';
  local_b0._0_8_ = ST::string::find((string *)local_110,4,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"4",
             "ST::string::from_validated(\"\" \"abcdABCDABCDabcd\" \"\", sizeof(\"abcdABCDABCDabcd\") - 1).find(4, \"ABCD\", ST::case_sensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,8);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])operator_new__(0x11);
  *(undefined8 *)local_110 = 0x4443424164636261;
  *(undefined8 *)((long)local_110 + 8) = 0x6463626144434241;
  *(char *)((long)local_110 + 0x10) = '\0';
  local_b0._0_8_ = ST::string::find((string *)local_110,5,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"8",
             "ST::string::from_validated(\"\" \"abcdABCDABCDabcd\" \"\", sizeof(\"abcdABCDABCDabcd\") - 1).find(5, \"ABCD\", ST::case_sensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,0xffffffff);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
  builtin_strncpy(acStack_100,"abcdABCDabcd",0xd);
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_b0._0_8_ = ST::string::find((string *)local_110,5,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"-1",
             "ST::string::from_validated(\"\" \"abcdABCDabcd\" \"\", sizeof(\"abcdABCDabcd\") - 1).find(5, \"ABCD\", ST::case_sensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6a9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,0xffffffff);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
  builtin_strncpy(acStack_100,"abcdABCDabcd",0xd);
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_b0._0_8_ = ST::string::find((string *)local_110,100,"ABCD",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"-1",
             "ST::string::from_validated(\"\" \"abcdABCDabcd\" \"\", sizeof(\"abcdABCDabcd\") - 1).find(100, \"ABCD\", ST::case_sensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6aa,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,0xffffffff);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"abcdxxxx",9);
  local_110 = (undefined1  [8])acStack_100;
  local_b0._0_8_ = ST::string::find((string *)local_110,1,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"-1",
             "ST::string::from_validated(\"\" \"abcdxxxx\" \"\", sizeof(\"abcdxxxx\") - 1).find(1, \"ABCD\", ST::case_insensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6ad,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,4);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])operator_new__(0x11);
  *(undefined8 *)local_110 = 0x6463626178787878;
  *(undefined8 *)((long)local_110 + 8) = 0x7878787864636261;
  *(char *)((long)local_110 + 0x10) = '\0';
  local_b0._0_8_ = ST::string::find((string *)local_110,1,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"4",
             "ST::string::from_validated(\"\" \"xxxxabcdabcdxxxx\" \"\", sizeof(\"xxxxabcdabcdxxxx\") - 1).find(1, \"ABCD\", ST::case_insensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6ae,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,4);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])operator_new__(0x11);
  *(undefined8 *)local_110 = 0x6463626178787878;
  *(undefined8 *)((long)local_110 + 8) = 0x7878787864636261;
  *(char *)((long)local_110 + 0x10) = '\0';
  local_b0._0_8_ = ST::string::find((string *)local_110,4,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"4",
             "ST::string::from_validated(\"\" \"xxxxabcdabcdxxxx\" \"\", sizeof(\"xxxxabcdabcdxxxx\") - 1).find(4, \"ABCD\", ST::case_insensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6af,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,8);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])operator_new__(0x11);
  *(undefined8 *)local_110 = 0x6463626178787878;
  *(undefined8 *)((long)local_110 + 8) = 0x7878787864636261;
  *(char *)((long)local_110 + 0x10) = '\0';
  local_b0._0_8_ = ST::string::find((string *)local_110,5,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"8",
             "ST::string::from_validated(\"\" \"xxxxabcdabcdxxxx\" \"\", sizeof(\"xxxxabcdabcdxxxx\") - 1).find(5, \"ABCD\", ST::case_insensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,0xffffffff);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
  builtin_strncpy(acStack_100,"xxxxabcdxxxx",0xd);
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_b0._0_8_ = ST::string::find((string *)local_110,5,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"-1",
             "ST::string::from_validated(\"\" \"xxxxabcdxxxx\" \"\", sizeof(\"xxxxabcdxxxx\") - 1).find(5, \"ABCD\", ST::case_insensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,0xffffffff);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
  builtin_strncpy(acStack_100,"xxxxabcdxxxx",0xd);
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  local_110 = (undefined1  [8])acStack_100;
  local_b0._0_8_ = ST::string::find((string *)local_110,100,"ABCD",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"-1",
             "ST::string::from_validated(\"\" \"xxxxabcdxxxx\" \"\", sizeof(\"xxxxabcdxxxx\") - 1).find(100, \"ABCD\", ST::case_insensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,0xffffffff);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxx",5);
  pcVar4 = "";
  local_110 = (undefined1  [8])acStack_100;
  local_b0._0_8_ = ST::string::find((string *)local_110,0,"",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"\", ST::case_sensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,0xffffffff);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxx",5);
  pcVar4 = "";
  local_110 = (undefined1  [8])acStack_100;
  local_b0._0_8_ = ST::string::find((string *)local_110,0,"",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(\"\", ST::case_insensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,0xffffffff);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxx",5);
  pcVar4 = "";
  local_110 = (undefined1  [8])acStack_100;
  local_b0._0_8_ = ST::string::find((string *)local_110,4,"",case_sensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(4, \"\", ST::case_sensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_90.m_buffer.m_chars = (char *)CONCAT44(local_90.m_buffer.m_chars._4_4_,0xffffffff);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  acStack_100[8] = '\0';
  acStack_100[9] = '\0';
  acStack_100[10] = '\0';
  acStack_100[0xb] = '\0';
  acStack_100[0xc] = '\0';
  acStack_100[0xd] = '\0';
  acStack_100[0xe] = '\0';
  acStack_100[0xf] = '\0';
  builtin_strncpy(acStack_100,"xxxx",5);
  pcVar4 = "";
  local_110 = (undefined1  [8])acStack_100;
  local_b0._0_8_ = ST::string::find((string *)local_110,4,"",case_insensitive);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&local_f0,"-1",
             "ST::string::from_validated(\"\" \"xxxx\" \"\", sizeof(\"xxxx\") - 1).find(4, \"\", ST::case_insensitive)"
             ,(int *)&local_90,(long *)local_b0);
  if ((0xf < local_108) &&
     ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_110 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
     ) {
    operator_delete__((void *)local_110);
  }
  if (local_f0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_110);
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x6b8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_110 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f <
       local_c8._M_p) && (local_d0 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_d0);
  }
  return;
}

Assistant:

TEST(string, find)
{
    // Available string, case sensitive
    EXPECT_EQ(0, ST_LITERAL("ABCDabcd").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(4, ST_LITERAL("abcdABCDABCDabcd").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(4, ST_LITERAL("abcdABCDabcd").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(4, ST_LITERAL("abcdABCD").find("ABCD", ST::case_sensitive));

    // Available string, case insensitive
    EXPECT_EQ(0, ST_LITERAL("ABCDxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCDABCDxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCDxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCD").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(0, ST_LITERAL("abcdxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxabcdABCDxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxabcdxxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxabcd").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(0, ST_LITERAL("ABCDxxxx").find("abcd", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCDabcdxxxx").find("abcd", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCDxxxx").find("abcd", ST::case_insensitive));
    EXPECT_EQ(4, ST_LITERAL("xxxxABCD").find("abcd", ST::case_insensitive));

    // Unavailable string
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxABC").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxABC").find("ABCD", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxABCxxxx").find("ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxABCxxxx").find("ABCD", ST::case_insensitive));

    // Empty string
    EXPECT_EQ(-1, ST::string().find("AAAA", ST::case_sensitive));
    EXPECT_EQ(-1, ST::string().find("AAAA", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find((const char *)nullptr, ST::case_sensitive));
    EXPECT_EQ(-1, ST::string().find("", ST::case_sensitive));
    EXPECT_EQ(-1, ST::string().find((const char *)nullptr, ST::case_sensitive));

    // Unicode substring
    ST::string haystack;
    haystack = ST_LITERAL("xxxx") + ST::string::from_utf32(test_data);
    EXPECT_EQ(4, haystack.find(utf8_test_data, ST::case_sensitive));
    EXPECT_EQ(4, haystack.find(utf8_test_data, ST::case_insensitive));

    haystack = ST::string::from_utf32(test_data) + ST_LITERAL("xxxx");
    EXPECT_EQ(0, haystack.find(utf8_test_data, ST::case_sensitive));
    EXPECT_EQ(0, haystack.find(utf8_test_data, ST::case_insensitive));

    haystack = ST_LITERAL("xxxx") + ST::string::from_utf32(test_data) + ST_LITERAL("xxxx");
    EXPECT_EQ(4, haystack.find(utf8_test_data, ST::case_sensitive));
    EXPECT_EQ(4, haystack.find(utf8_test_data, ST::case_insensitive));

    // Starting position, case senstive
    EXPECT_EQ(-1, ST_LITERAL("ABCDabcd").find(1, "ABCD", ST::case_sensitive));
    EXPECT_EQ( 4, ST_LITERAL("abcdABCDABCDabcd").find(1, "ABCD", ST::case_sensitive));
    EXPECT_EQ( 4, ST_LITERAL("abcdABCDABCDabcd").find(4, "ABCD", ST::case_sensitive));
    EXPECT_EQ( 8, ST_LITERAL("abcdABCDABCDabcd").find(5, "ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("abcdABCDabcd").find(5, "ABCD", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("abcdABCDabcd").find(100, "ABCD", ST::case_sensitive));

    // Starting position, case insenstive
    EXPECT_EQ(-1, ST_LITERAL("abcdxxxx").find(1, "ABCD", ST::case_insensitive));
    EXPECT_EQ( 4, ST_LITERAL("xxxxabcdabcdxxxx").find(1, "ABCD", ST::case_insensitive));
    EXPECT_EQ( 4, ST_LITERAL("xxxxabcdabcdxxxx").find(4, "ABCD", ST::case_insensitive));
    EXPECT_EQ( 8, ST_LITERAL("xxxxabcdabcdxxxx").find(5, "ABCD", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxabcdxxxx").find(5, "ABCD", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxxabcdxxxx").find(100, "ABCD", ST::case_insensitive));

    // Empty search string
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find("", ST::case_insensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find(4, "", ST::case_sensitive));
    EXPECT_EQ(-1, ST_LITERAL("xxxx").find(4, "", ST::case_insensitive));
}